

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall
leveldb::AddBoundaryInputsTest_TestEmptyCompactionFiles_Test::
AddBoundaryInputsTest_TestEmptyCompactionFiles_Test
          (AddBoundaryInputsTest_TestEmptyCompactionFiles_Test *this)

{
  AddBoundaryInputsTest_TestEmptyCompactionFiles_Test *this_local;
  
  AddBoundaryInputsTest::AddBoundaryInputsTest(&this->super_AddBoundaryInputsTest);
  (this->super_AddBoundaryInputsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__AddBoundaryInputsTest_TestEmptyCompactionFiles_Test_001bb2b0;
  return;
}

Assistant:

TEST_F(AddBoundaryInputsTest, TestEmptyCompactionFiles) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 2, kTypeValue),
                         InternalKey(InternalKey("100", 1, kTypeValue)));
  level_files_.push_back(f1);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_TRUE(compaction_files_.empty());
  ASSERT_EQ(1, level_files_.size());
  ASSERT_EQ(f1, level_files_[0]);
}